

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O0

void helper_dc_zva_aarch64(CPUARMState_conflict *env,uint64_t vaddr_in)

{
  uc_struct_conflict2 *puVar1;
  uint uVar2;
  uint idx;
  TCGMemOpIdx oi_00;
  ArchCPU_conflict1 *pAVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  target_ulong addr;
  uintptr_t unaff_retaddr;
  uint64_t va;
  TCGMemOpIdx oi;
  uint mmu_idx;
  int i;
  int try;
  void *hostaddr [2];
  int maxidx;
  uint64_t vaddr;
  uint64_t blocklen;
  ARMCPU_conflict *cpu;
  uc_struct_conflict2 *uc;
  uint64_t vaddr_in_local;
  CPUARMState_conflict *env_local;
  
  puVar1 = env->uc;
  pAVar3 = env_archcpu(env);
  uVar4 = (ulong)(4 << ((byte)pAVar3->dcz_blocksize & 0x1f));
  uVar5 = vaddr_in & (uVar4 - 1 ^ 0xffffffffffffffff);
  uVar2 = (uint)(((uVar4 + (long)-(int)puVar1->init_target_page->mask) - 1) /
                (ulong)(long)-(int)puVar1->init_target_page->mask);
  idx = cpu_mmu_index(env,false);
  oi_00 = make_memop_idx(MO_8,idx);
  if (2 < uVar2) {
    __assert_fail("maxidx <= ARRAY_SIZE(hostaddr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper-a64.c"
                  ,0x44c,"void helper_dc_zva_aarch64(CPUARMState *, uint64_t)");
  }
  mmu_idx = 0;
  do {
    if (1 < (int)mmu_idx) {
      for (oi = 0; (ulong)(long)(int)oi < uVar4; oi = oi + 1) {
        helper_ret_stb_mmu_aarch64(env,uVar5 + (long)(int)oi,'\0',oi_00,unaff_retaddr);
      }
      return;
    }
    for (oi = 0; (int)oi < (int)uVar2; oi = oi + 1) {
      pvVar6 = tlb_vaddr_to_host_aarch64
                         (env,uVar5 + (long)(int)(-(int)puVar1->init_target_page->mask * oi),
                          MMU_DATA_STORE,idx);
      *(void **)(&i + (long)(int)oi * 2) = pvVar6;
      if (*(long *)(&i + (long)(int)oi * 2) == 0) break;
    }
    if (oi == uVar2) {
      for (oi = 0; (int)oi < (int)(uVar2 - 1); oi = oi + 1) {
        memset(*(void **)(&i + (long)(int)oi * 2),0,(long)-(int)puVar1->init_target_page->mask);
      }
      memset(*(void **)(&i + (long)(int)oi * 2),0,
             uVar4 - (long)(int)(oi * -(int)puVar1->init_target_page->mask));
      return;
    }
    helper_ret_stb_mmu_aarch64(env,vaddr_in,'\0',oi_00,unaff_retaddr);
    for (oi = 0; (int)oi < (int)uVar2; oi = oi + 1) {
      addr = uVar5 + (long)(int)(-(int)puVar1->init_target_page->mask * oi);
      if (addr != (vaddr_in & puVar1->init_target_page->mask)) {
        helper_ret_stb_mmu_aarch64(env,addr,'\0',oi_00,unaff_retaddr);
      }
    }
    mmu_idx = mmu_idx + 1;
  } while( true );
}

Assistant:

void HELPER(dc_zva)(CPUARMState *env, uint64_t vaddr_in)
{
    /*
     * Implement DC ZVA, which zeroes a fixed-length block of memory.
     * Note that we do not implement the (architecturally mandated)
     * alignment fault for attempts to use this on Device memory
     * (which matches the usual QEMU behaviour of not implementing either
     * alignment faults or any memory attribute handling).
     */

    struct uc_struct *uc = env->uc;
    ARMCPU *cpu = env_archcpu(env);
    uint64_t blocklen = 4 << cpu->dcz_blocksize;
    uint64_t vaddr = vaddr_in & ~(blocklen - 1);
    /*
     * Slightly awkwardly, QEMU's TARGET_PAGE_SIZE may be less than
     * the block size so we might have to do more than one TLB lookup.
     * We know that in fact for any v8 CPU the page size is at least 4K
     * and the block size must be 2K or less, but TARGET_PAGE_SIZE is only
     * 1K as an artefact of legacy v5 subpage support being present in the
     * same QEMU executable. So in practice the hostaddr[] array has
     * two entries, given the current setting of TARGET_PAGE_BITS_MIN.
     */
    int maxidx = DIV_ROUND_UP(blocklen, TARGET_PAGE_SIZE);
    void *hostaddr[DIV_ROUND_UP(2 * KiB, 1 << TARGET_PAGE_BITS_MIN)];
    int try, i;
    unsigned mmu_idx = cpu_mmu_index(env, false);
    TCGMemOpIdx oi = make_memop_idx(MO_UB, mmu_idx);

    assert(maxidx <= ARRAY_SIZE(hostaddr));

    for (try = 0; try < 2; try++) {

        for (i = 0; i < maxidx; i++) {
            hostaddr[i] = tlb_vaddr_to_host(env,
                    vaddr + TARGET_PAGE_SIZE * i,
                    1, mmu_idx);
            if (!hostaddr[i]) {
                break;
            }
        }
        if (i == maxidx) {
            /*
             * If it's all in the TLB it's fair game for just writing to;
             * we know we don't need to update dirty status, etc.
             */
            for (i = 0; i < maxidx - 1; i++) {
                memset(hostaddr[i], 0, TARGET_PAGE_SIZE);
            }
            memset(hostaddr[i], 0, blocklen - (i * TARGET_PAGE_SIZE));
            return;
        }
        /*
         * OK, try a store and see if we can populate the tlb. This
         * might cause an exception if the memory isn't writable,
         * in which case we will longjmp out of here. We must for
         * this purpose use the actual register value passed to us
         * so that we get the fault address right.
         */
        helper_ret_stb_mmu(env, vaddr_in, 0, oi, GETPC());
        /* Now we can populate the other TLB entries, if any */
        for (i = 0; i < maxidx; i++) {
            uint64_t va = vaddr + TARGET_PAGE_SIZE * i;
            if (va != (vaddr_in & TARGET_PAGE_MASK)) {
                helper_ret_stb_mmu(env, va, 0, oi, GETPC());
            }
        }
    }

    /*
     * Slow path (probably attempt to do this to an I/O device or
     * similar, or clearing of a block of code we have translations
     * cached for). Just do a series of byte writes as the architecture
     * demands. It's not worth trying to use a cpu_physical_memory_map(),
     * memset(), unmap() sequence here because:
     *  + we'd need to account for the blocksize being larger than a page
     *  + the direct-RAM access case is almost always going to be dealt
     *    with in the fastpath code above, so there's no speed benefit
     *  + we would have to deal with the map returning NULL because the
     *    bounce buffer was in use
     */
    for (i = 0; i < blocklen; i++) {
        helper_ret_stb_mmu(env, vaddr + i, 0, oi, GETPC());
    }
}